

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ByteCodeSerializer.cpp
# Opt level: O3

byte * Js::ByteCodeBufferReader::ReadInt32(byte *buffer,size_t remainingBytes,int *value)

{
  ushort uVar1;
  int iVar2;
  code *pcVar3;
  bool bVar4;
  undefined4 *puVar5;
  char16_t *form;
  byte bVar6;
  long lVar7;
  
  if (remainingBytes == 0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar5 = 1;
    bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/ByteCodeSerializer.cpp"
                                ,0x130,"(remainingBytes >= sizeof(byte))",
                                "remainingBytes >= sizeof(byte)");
    if (!bVar4) goto LAB_00870b96;
    *puVar5 = 0;
    bVar6 = *buffer;
    if (0xfd < bVar6) goto LAB_00870971;
LAB_00870a56:
    *value = (uint)bVar6;
    bVar4 = Phases::IsEnabled((Phases *)&DAT_015bc490,VariableIntEncodingPhase);
    lVar7 = 1;
    if (!bVar4) goto LAB_00870b81;
    form = L"TestTrace: VariableIntEncoding (decode) - 1 byte, value %u\n";
  }
  else {
    bVar6 = *buffer;
    if (bVar6 < 0xfe) goto LAB_00870a56;
    if (remainingBytes == 1) {
      puVar5 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
LAB_00870971:
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      *puVar5 = 1;
      bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/ByteCodeSerializer.cpp"
                                  ,0x135,"(remainingBytes >= sizeof(uint16))",
                                  "remainingBytes >= sizeof(uint16)");
      if (!bVar4) goto LAB_00870b96;
      *puVar5 = 0;
    }
    if (bVar6 == 0xfe) {
      uVar1 = *(ushort *)(buffer + 1);
      if (uVar1 < 0xfe) {
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        puVar5 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
        *puVar5 = 1;
        bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/ByteCodeSerializer.cpp"
                                    ,0x13b,"(twoByteValue > ((byte) 0xfd))",
                                    "twoByteValue > ONE_BYTE_MAX");
        if (!bVar4) {
LAB_00870b96:
          pcVar3 = (code *)invalidInstructionException();
          (*pcVar3)();
        }
        *puVar5 = 0;
      }
      *value = (uint)uVar1;
      bVar4 = Phases::IsEnabled((Phases *)&DAT_015bc490,VariableIntEncodingPhase);
      lVar7 = 3;
      if (!bVar4) goto LAB_00870b81;
      form = L"TestTrace: VariableIntEncoding (decode)- 2 bytes, value %u\n";
    }
    else {
      if (remainingBytes < 4) {
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        puVar5 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
        *puVar5 = 1;
        bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/ByteCodeSerializer.cpp"
                                    ,0x143,"(remainingBytes >= sizeof(T))",
                                    "remainingBytes >= sizeof(T)");
        if (!bVar4) goto LAB_00870b96;
        *puVar5 = 0;
      }
      iVar2 = *(int *)(buffer + 1);
      *value = iVar2;
      if (0xffff0000 < iVar2 - 0x10000U) {
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        puVar5 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
        *puVar5 = 1;
        bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/ByteCodeSerializer.cpp"
                                    ,0x146,"(*value > ((uint16) 0xffff) || *value <= 0)",
                                    "*value > TWO_BYTE_MAX || *value <= 0");
        if (!bVar4) goto LAB_00870b96;
        *puVar5 = 0;
      }
      bVar4 = Phases::IsEnabled((Phases *)&DAT_015bc490,VariableIntEncodingPhase);
      lVar7 = 5;
      if (!bVar4) goto LAB_00870b81;
      form = L"TestTrace: VariableIntEncoding (decode) - 4 bytes, value %u\n";
    }
  }
  Output::Print(form,(ulong)(uint)*value);
  Output::Flush();
LAB_00870b81:
  return buffer + lVar7;
}

Assistant:

static const byte * ReadInt32(const byte * buffer, size_t remainingBytes, int * value)
    {
#if VARIABLE_INT_ENCODING
        return ReadVariableInt<int>(buffer, remainingBytes, value);
#else
        Assert(remainingBytes >= sizeof(int));
        return ReadConstantSizedInt32(buffer, remainingBytes, value);
#endif
    }